

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::
CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test::TestBody
          (CopyMessageTest_ArenaEnabledCopyConstructorArenaLeakTest_Test *this)

{
  undefined1 *puVar1;
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  void *pvVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *lhs;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *rhs;
  char *pcVar3;
  AssertHelper AStack_418;
  Message local_410;
  AssertionResult gtest_ar;
  Arena arena;
  TestAllTypes message1;
  
  proto2_unittest::TestAllTypes::TestAllTypes(&message1);
  puVar1 = &arena.impl_.field_0x10;
  arena.impl_.tag_and_id_ = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct((ulong)&arena,-0x18);
  message1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       message1.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  if ((message1.super_Message.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
    message1.super_Message.super_MessageLite._internal_metadata_.ptr_ =
         *(undefined8 *)
          (message1.super_Message.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffe);
  }
  protobuf::internal::ArenaStringPtr::Set
            (&message1.field_0._impl_.optional_string_,(string *)&arena,
             (Arena *)message1.super_Message.super_MessageLite._internal_metadata_.ptr_);
  std::__cxx11::string::~string((string *)&arena);
  arena.impl_.tag_and_id_ = (uint64_t)puVar1;
  std::__cxx11::string::_M_construct((ulong)&arena,-0x18);
  this_00 = &message1.field_0._impl_.repeated_string_;
  protobuf::internal::RepeatedPtrFieldBase::
  Add<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
            (&this_00->super_RepeatedPtrFieldBase,
             (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)&arena);
  std::__cxx11::string::~string((string *)&arena);
  protobuf::internal::ThreadSafeArena::ThreadSafeArena(&arena.impl_);
  pvVar2 = Arena::CopyConstruct<proto2_unittest::TestAllTypes>(&arena,&message1);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"message2->optional_string()","message1.optional_string()",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(ulong *)((long)pvVar2 + 0x1f8) & 0xfffffffffffffffc),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((ulong)message1.field_0._impl_.optional_string_.tagged_ptr_.ptr_ & 0xfffffffffffffffc)
            );
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_410);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/copy_unittest.cc"
               ,0x3b,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&AStack_418);
    if (local_410.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_410.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  lhs = protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  ((RepeatedPtrFieldBase *)((long)pvVar2 + 0xf0),0);
  rhs = protobuf::internal::RepeatedPtrFieldBase::
        Get<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
                  (&this_00->super_RepeatedPtrFieldBase,0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar,"message2->repeated_string(0)","message1.repeated_string(0)",lhs,
             rhs);
  if (gtest_ar.success_ == false) {
    testing::Message::Message(&local_410);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar3 = anon_var_dwarf_651463 + 5;
    }
    else {
      pcVar3 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/copy_unittest.cc"
               ,0x3c,pcVar3);
    testing::internal::AssertHelper::operator=(&AStack_418,&local_410);
    testing::internal::AssertHelper::~AssertHelper(&AStack_418);
    if (local_410.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_410.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  protobuf::internal::ThreadSafeArena::~ThreadSafeArena(&arena.impl_);
  proto2_unittest::TestAllTypes::~TestAllTypes(&message1);
  return;
}

Assistant:

TEST(CopyMessageTest, ArenaEnabledCopyConstructorArenaLeakTest) {
  // Set possible leaking field types for TestAllTypes with values
  // guaranteed to not be inlined string or Cord values.
  // TestAllTypes has unconditional ArenaDtor registration.
  proto2_unittest::TestAllTypes message1;

  message1.set_optional_string(std::string(1000, 'a'));
  message1.add_repeated_string(std::string(1000, 'd'));

  Arena arena;
  proto2_unittest::TestAllTypes* message2 =
      Arena::Create<proto2_unittest::TestAllTypes>(&arena, message1);

  EXPECT_EQ(message2->optional_string(), message1.optional_string());
  EXPECT_EQ(message2->repeated_string(0), message1.repeated_string(0));
}